

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O2

bool __thiscall OpenMesh::PolyConnectivity::is_boundary(PolyConnectivity *this,EdgeHandle _eh)

{
  bool bVar1;
  
  bVar1 = ArrayKernel::is_boundary
                    (&this->super_ArrayKernel,(HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2));
  if (bVar1) {
    return true;
  }
  bVar1 = ArrayKernel::is_boundary
                    (&this->super_ArrayKernel,
                     (HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2 | 1));
  return bVar1;
}

Assistant:

bool is_boundary(EdgeHandle _eh) const
  {
    return (is_boundary(halfedge_handle(_eh, 0)) ||
            is_boundary(halfedge_handle(_eh, 1)));
  }